

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderMembers
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined2 local_2b8;
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined2 local_268;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined2 local_218;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined2 local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined2 local_178;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  vars = &this->variables_;
  text._M_str = "private $type$ $name$_;\n";
  text._M_len = 0x18;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  text_00._M_str =
       "private com.google.protobuf.SingleFieldBuilder<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
  ;
  text_00._M_len = 0x6d;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,(Options *)local_80,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  text_01._M_str =
       "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $get_has_field_bit_builder$;\n}\n"
  ;
  text_01._M_len = 100;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_d0[4] = (pCVar2->options_).opensource_runtime;
  local_d0[5] = (pCVar2->options_).annotate_code;
  local_d0[0] = (pCVar2->options_).generate_immutable_code;
  local_d0[1] = (pCVar2->options_).generate_mutable_code;
  local_d0[2] = (pCVar2->options_).generate_shared_code;
  local_d0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,(Options *)local_d0,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x17])
            (this,printer,"$deprecation$public $type$ ${$get$capitalized_name$$}$()",
             "return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n",
             "return $name$Builder_.getMessage();\n",0,0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_120[4] = (pCVar2->options_).opensource_runtime;
  local_120[5] = (pCVar2->options_).annotate_code;
  local_120[0] = (pCVar2->options_).generate_immutable_code;
  local_120[1] = (pCVar2->options_).generate_mutable_code;
  local_120[2] = (pCVar2->options_).generate_shared_code;
  local_120[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_118._M_p = (pointer)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_120,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x17])
            (this,printer,"$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$name$_ = value;\n",
             "$name$Builder_.setMessage(value);\n",
             "$set_has_field_bit_builder$\n$on_changed$\nreturn this;\n",0x100000001);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_170[4] = (pCVar2->options_).opensource_runtime;
  local_170[5] = (pCVar2->options_).annotate_code;
  local_170[0] = (pCVar2->options_).generate_immutable_code;
  local_170[1] = (pCVar2->options_).generate_mutable_code;
  local_170[2] = (pCVar2->options_).generate_shared_code;
  local_170[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_148._M_p = (pointer)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_128._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_128._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_170,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x17])
            (this,printer,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    $type$.Builder builderForValue)"
             ,"$name$_ = builderForValue.build();\n",
             "$name$Builder_.setMessage(builderForValue.build());\n",
             "$set_has_field_bit_builder$\n$on_changed$\nreturn this;\n",0x100000001);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_1c0[4] = (pCVar2->options_).opensource_runtime;
  local_1c0[5] = (pCVar2->options_).annotate_code;
  local_1c0[0] = (pCVar2->options_).generate_immutable_code;
  local_1c0[1] = (pCVar2->options_).generate_mutable_code;
  local_1c0[2] = (pCVar2->options_).generate_shared_code;
  local_1c0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_1b8._M_p = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_198._M_p = (pointer)&local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_178._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_178._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_1c0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x17])
            (this,printer,"$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",
             "if ($get_has_field_bit_builder$ &&\n  $name$_ != null &&\n  $name$_ != $type$.getDefaultInstance()) {\n  get$capitalized_name$Builder().mergeFrom(value);\n} else {\n  $name$_ = value;\n}\n"
             ,"$name$Builder_.mergeFrom(value);\n",
             "if ($name$_ != null) {\n  $set_has_field_bit_builder$\n  $on_changed$\n}\nreturn this;\n"
             ,0x100000001);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_210[4] = (pCVar2->options_).opensource_runtime;
  local_210[5] = (pCVar2->options_).annotate_code;
  local_210[0] = (pCVar2->options_).generate_immutable_code;
  local_210[1] = (pCVar2->options_).generate_mutable_code;
  local_210[2] = (pCVar2->options_).generate_shared_code;
  local_210[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_208._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_1e8._M_p = (pointer)&local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_1c8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_1c8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_210,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  text_02._M_str =
       "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $clear_has_field_bit_builder$\n  $name$_ = null;\n  if ($name$Builder_ != null) {\n    $name$Builder_.dispose();\n    $name$Builder_ = null;\n  }\n  $on_changed$\n  return this;\n}\n"
  ;
  text_02._M_len = 0xed;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_260[4] = (pCVar2->options_).opensource_runtime;
  local_260[5] = (pCVar2->options_).annotate_code;
  local_260[0] = (pCVar2->options_).generate_immutable_code;
  local_260[1] = (pCVar2->options_).generate_mutable_code;
  local_260[2] = (pCVar2->options_).generate_shared_code;
  local_260[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_258._M_p = (pointer)&local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_238._M_p = (pointer)&local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_218._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_218._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_260,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != &local_228) {
    operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
  }
  text_03._M_str =
       "$deprecation$public $type$.Builder ${$get$capitalized_name$Builder$}$() {\n  $set_has_field_bit_builder$\n  $on_changed$\n  return get$capitalized_name$FieldBuilder().getBuilder();\n}\n"
  ;
  text_03._M_len = 0xb4;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  begin_varname_01._M_str = "{";
  begin_varname_01._M_len = 1;
  end_varname_01._M_str = "}";
  end_varname_01._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_01,end_varname_01,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_2b0[4] = (pCVar2->options_).opensource_runtime;
  local_2b0[5] = (pCVar2->options_).annotate_code;
  local_2b0[0] = (pCVar2->options_).generate_immutable_code;
  local_2b0[1] = (pCVar2->options_).generate_mutable_code;
  local_2b0[2] = (pCVar2->options_).generate_shared_code;
  local_2b0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_2a8._M_p = (pointer)&local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_288._M_p = (pointer)&local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_268._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_268._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_2b0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p,local_298._M_allocated_capacity + 1);
  }
  text_04._M_str =
       "$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$() {\n  if ($name$Builder_ != null) {\n    return $name$Builder_.getMessageOrBuilder();\n  } else {\n    return $name$_ == null ?\n        $type$.getDefaultInstance() : $name$_;\n  }\n}\n"
  ;
  text_04._M_len = 0xfb;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_02._M_str = "{";
  begin_varname_02._M_len = 1;
  end_varname_02._M_str = "}";
  end_varname_02._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_02,end_varname_02,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_300[4] = (pCVar2->options_).opensource_runtime;
  local_300[5] = (pCVar2->options_).annotate_code;
  local_300[0] = (pCVar2->options_).generate_immutable_code;
  local_300[1] = (pCVar2->options_).generate_mutable_code;
  local_300[2] = (pCVar2->options_).generate_shared_code;
  local_300[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_2f8._M_p = (pointer)&local_2e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_2d8._M_p = (pointer)&local_2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_2b8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_2b8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_300,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != &local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_p != &local_2e8) {
    operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
  }
  text_05._M_str =
       "private com.google.protobuf.SingleFieldBuilder<\n    $type$, $type$.Builder, $type$OrBuilder> \n    get$capitalized_name$FieldBuilder() {\n  if ($name$Builder_ == null) {\n    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            get$capitalized_name$(),\n            getParentForChildren(),\n            isClean());\n    $name$_ = null;\n  }\n  return $name$Builder_;\n}\n"
  ;
  text_05._M_len = 0x1af;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_05);
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.
  printer->Print(variables_, "private $type$ $name$_;\n");

  printer->Print(variables_,
                 // If this builder is non-null, it is used and the other fields
                 // are ignored.
                 "private com.google.protobuf.SingleFieldBuilder<\n"
                 "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
                 "\n");

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $get_has_field_bit_builder$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field getField()
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  PrintNestedBuilderFunction(
      printer, "$deprecation$public $type$ ${$get$capitalized_name$$}$()",
      "return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n",
      "return $name$Builder_.getMessage();\n", nullptr);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",

      "if (value == null) {\n"
      "  throw new NullPointerException();\n"
      "}\n"
      "$name$_ = value;\n",

      "$name$Builder_.setMessage(value);\n",

      "$set_has_field_bit_builder$\n"
      "$on_changed$\n"
      "return this;\n",
      Semantic::kSet);

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
      "    $type$.Builder builderForValue)",

      "$name$_ = builderForValue.build();\n",

      "$name$Builder_.setMessage(builderForValue.build());\n",

      "$set_has_field_bit_builder$\n"
      "$on_changed$\n"
      "return this;\n",
      Semantic::kSet);

  // Message.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",
      "if ($get_has_field_bit_builder$ &&\n"
      "  $name$_ != null &&\n"
      "  $name$_ != $type$.getDefaultInstance()) {\n"
      "  get$capitalized_name$Builder().mergeFrom(value);\n"
      "} else {\n"
      "  $name$_ = value;\n"
      "}\n",

      "$name$Builder_.mergeFrom(value);\n",

      "if ($name$_ != null) {\n"
      "  $set_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "}\n"
      "return this;\n",
      Semantic::kSet);

  // Message.Builder clearField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n"
      "  $name$_ = null;\n"
      "  if ($name$Builder_ != null) {\n"
      "    $name$Builder_.dispose();\n"
      "    $name$Builder_ = null;\n"
      "  }\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // Field.Builder getFieldBuilder()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public $type$.Builder "
                 "${$get$capitalized_name$Builder$}$() {\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return get$capitalized_name$FieldBuilder().getBuilder();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // FieldOrBuilder getFieldOrBuilder()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public $type$OrBuilder "
                 "${$get$capitalized_name$OrBuilder$}$() {\n"
                 "  if ($name$Builder_ != null) {\n"
                 "    return $name$Builder_.getMessageOrBuilder();\n"
                 "  } else {\n"
                 "    return $name$_ == null ?\n"
                 "        $type$.getDefaultInstance() : $name$_;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // SingleFieldBuilder getFieldFieldBuilder
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "private com.google.protobuf.SingleFieldBuilder<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> \n"
      "    get$capitalized_name$FieldBuilder() {\n"
      "  if ($name$Builder_ == null) {\n"
      "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n"
      "        $type$, $type$.Builder, $type$OrBuilder>(\n"
      "            get$capitalized_name$(),\n"
      "            getParentForChildren(),\n"
      "            isClean());\n"
      "    $name$_ = null;\n"
      "  }\n"
      "  return $name$Builder_;\n"
      "}\n");
}